

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,NumberFormat exitFormat,int *retCodeOut,
               _func_bool_int *retCodeOkay)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  long lVar4;
  bool local_13c;
  bool local_13a;
  bool local_139;
  NumberFormatter local_100;
  string_view local_f8;
  string_view local_e8;
  string local_d8;
  bool local_b2;
  undefined1 local_b1;
  bool success;
  duration<double,_std::ratio<1L,_1L>_> dStack_b0;
  bool retCodeSuccess;
  byte local_a5;
  int local_a4;
  undefined1 local_a0 [3];
  bool commandResult;
  int retCode;
  string output;
  string_view local_70;
  string_view local_60;
  string local_50;
  _func_bool_int *local_30;
  _func_bool_int *retCodeOkay_local;
  int *retCodeOut_local;
  NumberFormat exitFormat_local;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  char *comment_local;
  
  local_30 = retCodeOkay;
  retCodeOkay_local = (_func_bool_int *)retCodeOut;
  retCodeOut_local._0_4_ = exitFormat;
  retCodeOut_local._7_1_ = verbose;
  _exitFormat_local = command;
  command_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)comment;
  if (verbose) {
    poVar3 = std::operator<<((ostream *)&std::cout,comment);
    std::operator<<(poVar3,":\n");
    pvVar2 = _exitFormat_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60," ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70);
    cmJoin(&local_50,pvVar2,local_60,local_70);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)local_a0);
  pvVar2 = _exitFormat_local;
  local_a4 = 0;
  dStack_b0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  local_a5 = cmSystemTools::RunSingleCommand
                       (pvVar2,(string *)local_a0,(string *)local_a0,&local_a4,(char *)0x0,
                        OUTPUT_NONE,(cmDuration)dStack_b0.__r,Auto);
  local_139 = true;
  if (local_a4 != 0) {
    local_13a = false;
    if (local_30 != (_func_bool_int *)0x0) {
      local_13a = (*local_30)(local_a4);
    }
    local_139 = local_13a;
  }
  local_b1 = local_139;
  local_13c = false;
  if ((local_a5 & 1) != 0) {
    local_13c = (bool)local_b1;
  }
  local_b2 = local_13c;
  if (retCodeOkay_local != (_func_bool_int *)0x0) {
    if (((local_a5 & 1) == 0) && (local_139 != false)) {
      *(undefined4 *)retCodeOkay_local = 0xffffffff;
    }
    else {
      *(int *)retCodeOkay_local = local_a4;
    }
  }
  if (local_13c == false) {
    poVar3 = std::operator<<((ostream *)&std::cout,(char *)command_local);
    poVar3 = std::operator<<(poVar3,": command \"");
    pvVar2 = _exitFormat_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8," ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8);
    cmJoin(&local_d8,pvVar2,local_e8,local_f8);
    poVar3 = std::operator<<(poVar3,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"\" failed (exit code ");
    NumberFormatter::NumberFormatter(&local_100,(NumberFormat)retCodeOut_local,local_a4);
    poVar3 = operator<<(poVar3,&local_100);
    poVar3 = std::operator<<(poVar3,") with the following output:\n");
    std::operator<<(poVar3,(string *)local_a0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else if (((retCodeOut_local._7_1_ & 1) != 0) &&
          (lVar4 = std::__cxx11::string::find(local_a0,0xc07234), lVar4 == -1)) {
    std::operator<<((ostream *)&std::cout,(string *)local_a0);
  }
  bVar1 = local_b2;
  std::__cxx11::string::~string((string *)local_a0);
  return (bool)(bVar1 & 1);
}

Assistant:

static bool RunCommand(const char* comment,
                       std::vector<std::string> const& command, bool verbose,
                       NumberFormat exitFormat, int* retCodeOut = nullptr,
                       bool (*retCodeOkay)(int) = nullptr)
{
  if (verbose) {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
  }
  std::string output;
  int retCode = 0;
  bool commandResult = cmSystemTools::RunSingleCommand(
    command, &output, &output, &retCode, nullptr, cmSystemTools::OUTPUT_NONE);
  bool const retCodeSuccess =
    retCode == 0 || (retCodeOkay && retCodeOkay(retCode));
  bool const success = commandResult && retCodeSuccess;
  if (retCodeOut) {
    if (commandResult || !retCodeSuccess) {
      *retCodeOut = retCode;
    } else {
      *retCodeOut = -1;
    }
  }
  if (!success) {
    std::cout << comment << ": command \"" << cmJoin(command, " ")
              << "\" failed (exit code "
              << NumberFormatter(exitFormat, retCode)
              << ") with the following output:\n"
              << output;
  } else if (verbose) {
    // always print the output of the command, unless
    // it is the dumb rc command banner
    if (output.find("Resource Compiler Version") == std::string::npos) {
      std::cout << output;
    }
  }
  return success;
}